

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float tcu::sampleCubeSeamlessLinearCompare
                (ConstPixelBufferAccess (*faceAccesses) [6],CubeFace baseFace,Sampler *sampler,
                float ref,float s,float t)

{
  bool *pbVar1;
  ulong uVar2;
  int size_00;
  deInt32 x_;
  TextureFormat *format;
  float fVar3;
  float fVar4;
  float b;
  float a;
  int i_2;
  int i_1;
  int bothOutOfBoundsNdx;
  byte local_a9;
  undefined1 auStack_a8 [7];
  bool isFixedPointDepth;
  CubeFace local_a0;
  CubeFaceCoords<int> local_98;
  undefined8 local_8c;
  CubeFaceIntCoords coords;
  int i;
  bool hasBothCoordsOutOfBounds [4];
  float sampleRes [4];
  IVec2 baseSampleCoords [4];
  int y1;
  int y0;
  int x1;
  int x0;
  float v;
  float u;
  int size;
  float t_local;
  float s_local;
  float ref_local;
  Sampler *sampler_local;
  CubeFace baseFace_local;
  ConstPixelBufferAccess (*faceAccesses_local) [6];
  
  size_00 = ConstPixelBufferAccess::getWidth(*faceAccesses);
  x1 = (int)t;
  x0 = (int)s;
  if ((sampler->normalizedCoords & 1U) != 0) {
    x0 = (int)unnormalize(sampler->wrapS,s,size_00);
    x1 = (int)unnormalize(sampler->wrapT,t,size_00);
  }
  x_ = deFloorFloatToInt32((float)x0 - 0.5);
  baseSampleCoords[3].m_data[1] = deFloorFloatToInt32((float)x1 - 0.5);
  baseSampleCoords[3].m_data[0] = baseSampleCoords[3].m_data[1] + 1;
  Vector<int,_2>::Vector((Vector<int,_2> *)(sampleRes + 2),x_,baseSampleCoords[3].m_data[1]);
  Vector<int,_2>::Vector(baseSampleCoords,x_ + 1,baseSampleCoords[3].m_data[1]);
  Vector<int,_2>::Vector(baseSampleCoords + 1,x_,baseSampleCoords[3].m_data[0]);
  Vector<int,_2>::Vector(baseSampleCoords + 2,x_ + 1,baseSampleCoords[3].m_data[0]);
  for (coords.s = 0; coords.s < 4; coords.s = coords.s + 1) {
    CubeFaceCoords<int>::CubeFaceCoords(&local_98,baseFace,baseSampleCoords + (long)coords.s + -1);
    _auStack_a8 = remapCubeEdgeCoords(&local_98,size_00);
    local_8c = _auStack_a8;
    uVar2 = local_8c;
    coords.face = local_a0;
    local_8c._0_4_ = auStack_a8._0_4_;
    *(bool *)((long)&coords.t + (long)coords.s) = (CubeFace)local_8c == CUBEFACE_LAST;
    local_8c = uVar2;
    if ((*(byte *)((long)&coords.t + (long)coords.s) & 1) == 0) {
      format = ConstPixelBufferAccess::getFormat(*faceAccesses + (_auStack_a8 & 0xffffffff));
      local_a9 = isFixedPointDepthTextureFormat(format);
      ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&i_1,(int)faceAccesses + (CubeFace)local_8c * 0x28,
                 local_8c._4_4_,coords.face);
      fVar3 = execCompare((Vec4 *)&i_1,sampler->compare,sampler->compareChannel,ref,
                          (bool)(local_a9 & 1));
      *(float *)(hasBothCoordsOutOfBounds + (long)coords.s * 4 + -4) = fVar3;
    }
  }
  i_2 = -1;
  for (a = 0.0; (int)a < 4; a = (float)((int)a + 1)) {
    if ((*(byte *)((long)&coords.t + (long)(int)a) & 1) != 0) {
      i_2 = (int)a;
    }
  }
  if (i_2 != -1) {
    pbVar1 = hasBothCoordsOutOfBounds + (long)i_2 * 4 + -4;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    for (b = 0.0; (int)b < 4; b = (float)((int)b + 1)) {
      if (b != (float)i_2) {
        *(float *)(hasBothCoordsOutOfBounds + (long)i_2 * 4 + -4) =
             *(float *)(hasBothCoordsOutOfBounds + (long)(int)b * 4 + -4) +
             *(float *)(hasBothCoordsOutOfBounds + (long)i_2 * 4 + -4);
      }
    }
    *(float *)(hasBothCoordsOutOfBounds + (long)i_2 * 4 + -4) =
         *(float *)(hasBothCoordsOutOfBounds + (long)i_2 * 4 + -4) * 0.33333334;
  }
  fVar3 = deFloatFrac((float)x0 - 0.5);
  fVar4 = deFloatFrac((float)x1 - 0.5);
  return sampleRes[1] * fVar3 * fVar4 +
         sampleRes[0] * (1.0 - fVar3) * fVar4 +
         (float)i * (1.0 - fVar3) * (1.0 - fVar4) +
         (float)hasBothCoordsOutOfBounds * fVar3 * (1.0 - fVar4);
}

Assistant:

static float sampleCubeSeamlessLinearCompare (const ConstPixelBufferAccess (&faceAccesses)[CUBEFACE_LAST], CubeFace baseFace, const Sampler& sampler, float ref, float s, float t)
{
	DE_ASSERT(faceAccesses[0].getWidth() == faceAccesses[0].getHeight());

	int		size	= faceAccesses[0].getWidth();
	// Non-normalized coordinates.
	float	u		= s;
	float	v		= t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, size);
		v = unnormalize(sampler.wrapT, t, size);
	}

	int			x0						= deFloorFloatToInt32(u-0.5f);
	int			x1						= x0+1;
	int			y0						= deFloorFloatToInt32(v-0.5f);
	int			y1						= y0+1;
	IVec2		baseSampleCoords[4]		=
	{
		IVec2(x0, y0),
		IVec2(x1, y0),
		IVec2(x0, y1),
		IVec2(x1, y1)
	};
	float		sampleRes[4];
	bool		hasBothCoordsOutOfBounds[4]; //!< Whether correctCubeFace() returns CUBEFACE_LAST, i.e. both u and v are out of bounds.

	// Find correct faces and coordinates for out-of-bounds sample coordinates.

	for (int i = 0; i < 4; i++)
	{
		CubeFaceIntCoords coords = remapCubeEdgeCoords(CubeFaceIntCoords(baseFace, baseSampleCoords[i]), size);
		hasBothCoordsOutOfBounds[i] = coords.face == CUBEFACE_LAST;

		if (!hasBothCoordsOutOfBounds[i])
		{
			const bool isFixedPointDepth = isFixedPointDepthTextureFormat(faceAccesses[coords.face].getFormat());

			sampleRes[i] = execCompare(faceAccesses[coords.face].getPixel(coords.s, coords.t), sampler.compare, sampler.compareChannel, ref, isFixedPointDepth);
		}
	}

	// If a sample was out of bounds in both u and v, we get its color from the average of the three other samples.
	// \note This averaging behavior is not required by the GLES3 spec (though it is recommended). GLES3 spec only
	//		 requires that if the three other samples all have the same color, then the doubly-out-of-bounds sample
	//		 must have this color as well.

	{
		int bothOutOfBoundsNdx = -1;
		for (int i = 0; i < 4; i++)
		{
			if (hasBothCoordsOutOfBounds[i])
			{
				DE_ASSERT(bothOutOfBoundsNdx < 0); // Only one sample can be out of bounds in both u and v.
				bothOutOfBoundsNdx = i;
			}
		}
		if (bothOutOfBoundsNdx != -1)
		{
			sampleRes[bothOutOfBoundsNdx] = 0.0f;
			for (int i = 0; i < 4; i++)
				if (i != bothOutOfBoundsNdx)
					sampleRes[bothOutOfBoundsNdx] += sampleRes[i];

			sampleRes[bothOutOfBoundsNdx] = sampleRes[bothOutOfBoundsNdx] * (1.0f/3.0f);
		}
	}

	// Interpolate.

	float a = deFloatFrac(u-0.5f);
	float b = deFloatFrac(v-0.5f);

	return (sampleRes[0]*(1.0f-a)*(1.0f-b)) +
		   (sampleRes[1]*(     a)*(1.0f-b)) +
		   (sampleRes[2]*(1.0f-a)*(     b)) +
		   (sampleRes[3]*(     a)*(     b));
}